

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
::
linear_search_impl<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
           *this,int *k,size_type s,ulong e,checked_compare *comp)

{
  bool bVar1;
  key_type *lhs;
  checked_compare *comp_local;
  size_type e_local;
  size_type s_local;
  int *k_local;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *this_local;
  SearchResult<unsigned_long,_false> local_10;
  
  for (e_local = s; e_local < e; e_local = e_local + 1) {
    lhs = btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
          ::key((btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                 *)this,e_local);
    bVar1 = key_compare_adapter<std::less<int>,_int>::checked_compare::operator()<int,_int,_0>
                      (comp,lhs,k);
    if (!bVar1) break;
  }
  SearchResult<unsigned_long,_false>::SearchResult(&local_10,e_local);
  return (SearchResult<unsigned_long,_false>)local_10.value;
}

Assistant:

SearchResult<size_type, false> linear_search_impl(
      const K &k, size_type s, const size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return SearchResult<size_type, false>{s};
  }